

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O1

void swrenderer::R_DrawPSprite
               (DPSprite *pspr,AActor *owner,float bobx,float boby,double wx,double wy,
               double ticfrac)

{
  fixed_t *pfVar1;
  visstyle_t *pvVar2;
  vissprite_t *vis;
  float fVar3;
  double dVar4;
  byte bVar5;
  ushort uVar6;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0 color;
  AInventory *pAVar7;
  lighttable_t *plVar8;
  bool bVar9;
  vissprite_t *pvVar10;
  fixed_t fVar11;
  int iVar12;
  PalEntry fade;
  int iVar13;
  AWeapon *pAVar14;
  FDynamicColormap *pFVar15;
  lighttable_t *plVar16;
  short sVar17;
  long lVar18;
  FDynamicColormap *pFVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  anon_union_4_2_12391d7c_for_PalEntry_0 fade_00;
  DObject *p;
  FTexture *pFVar23;
  bool bVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  FRenderStyle style;
  FRenderStyle local_34;
  
  if (R_DrawPSprite(DPSprite*,AActor*,float,float,double,double,double)::avis == '\0') {
    R_DrawPSprite();
  }
  if (R_DrawPSprite::avis.Count < vispspindex + 1) {
    uVar21 = (R_DrawPSprite::avis.Count - vispspindex) + 1;
    TArray<swrenderer::vissprite_t,_swrenderer::vissprite_t>::Grow(&R_DrawPSprite::avis,uVar21);
    R_DrawPSprite::avis.Count = R_DrawPSprite::avis.Count + uVar21;
  }
  uVar21 = pspr->Sprite;
  if (sprites.Count <= uVar21) {
    DPrintf(1,"R_DrawPSprite: invalid sprite number %i\n");
    return;
  }
  if ((int)(uint)sprites.Array[(int)uVar21].numframes <= pspr->Frame) {
    DPrintf(1,"R_DrawPSprite: invalid sprite frame %i : %i\n");
    return;
  }
  lVar18 = (long)pspr->Frame + (ulong)sprites.Array[(int)uVar21].spriteframes;
  uVar20 = (ulong)SpriteFrames.Array[lVar18].Texture[0].texnum;
  if (uVar20 < TexMan.Textures.Count) {
    pFVar23 = TexMan.Textures.Array[TexMan.Translation.Array[uVar20]].Texture;
  }
  else {
    pFVar23 = (FTexture *)0x0;
  }
  if (pFVar23->UseType == '\r') {
    return;
  }
  uVar6 = SpriteFrames.Array[lVar18].Flip;
  if (pspr->firstTic == true) {
    pspr->firstTic = false;
    pspr->oldx = pspr->x;
    pspr->oldy = pspr->y;
  }
  pvVar10 = R_DrawPSprite::avis.Array;
  dVar26 = 0.0;
  dVar25 = 0.0;
  bVar24 = (pspr->Flags & 2U) != 0;
  if (bVar24) {
    dVar25 = (double)boby;
  }
  if (bVar24) {
    dVar26 = (double)bobx;
  }
  dVar26 = (pspr->x - pspr->oldx) * ticfrac + pspr->oldx + dVar26;
  dVar25 = pspr->oldy + 0.375 + dVar25 + (pspr->y - pspr->oldy) * ticfrac;
  if (((pspr->Flags & 1U) != 0) && (pspr->ID != 1)) {
    dVar26 = dVar26 + wx;
    dVar25 = dVar25 + wy;
  }
  dVar4 = (pFVar23->Scale).X;
  uVar21 = (uint)((double)(pFVar23->LeftOffset * 2) / dVar4);
  dVar27 = (dVar26 + -160.0) - (double)(int)((uVar21 & 1) + ((int)uVar21 >> 1));
  dVar26 = dVar27 * pspritexscale + CenterX + 6755399441055744.0;
  iVar22 = SUB84(dVar26,0);
  if (viewwidth < iVar22) {
    return;
  }
  uVar21 = (uint)((double)((uint)pFVar23->Width * 2) / dVar4);
  dVar4 = CenterX + 6755399441055744.0 +
          (dVar27 + (double)(int)((uVar21 & 1) + ((int)uVar21 >> 1))) * pspritexscale;
  iVar12 = SUB84(dVar4,0);
  if (iVar12 < 1) {
    return;
  }
  uVar20 = (ulong)vispspindex;
  vis = R_DrawPSprite::avis.Array + uVar20;
  R_DrawPSprite::avis.Array[uVar20].renderflags = (short)(owner->renderflags).Value;
  pvVar10[uVar20].floorclip = 0.0;
  pvVar10[uVar20].field_14.field_0.texturemid =
       (double)(int)pFVar23->TopOffset + (100.0 - dVar25) * (pFVar23->Scale).Y;
  if ((camera->player != (player_t *)0x0) &&
     ((((DFrameBuffer *)RenderTarget != screen || (viewheight == RenderTarget->Height)) ||
      ((0x140 < RenderTarget->Width && (st_scale.Value == false)))))) {
    p = (pspr->Caller).field_0.o;
    if ((p != (DObject *)0x0) && ((p->ObjectFlags & 0x20) != 0)) {
      (pspr->Caller).field_0.p = (AActor *)0x0;
      p = (DObject *)0x0;
    }
    pAVar14 = dyn_cast<AWeapon>(p);
    if ((pAVar14 != (AWeapon *)0x0) && (fVar3 = pAVar14->YAdjust, fVar3 != 0.0)) {
      if (((DFrameBuffer *)RenderTarget == screen) && (viewheight != RenderTarget->Height)) {
        dVar25 = (double)fVar3 * StatusBar->Displacement;
      }
      else {
        dVar25 = (double)fVar3;
      }
      (vis->field_14).field_0.texturemid = (vis->field_14).field_0.texturemid - dVar25;
    }
  }
  if (pspr->ID < 0x7ffffffd) {
    dVar25 = AspectPspriteOffset(WidescreenRatio);
    (vis->field_14).field_0.texturemid = (vis->field_14).field_0.texturemid - dVar25;
  }
  fVar11 = 0;
  sVar17 = 0;
  if (0 < iVar22) {
    sVar17 = SUB82(dVar26,0);
  }
  vis->x1 = sVar17;
  sVar17 = (short)viewwidth;
  if (iVar12 < viewwidth) {
    sVar17 = SUB82(dVar4,0);
  }
  vis->x2 = sVar17;
  vis->xscale = SUB84(pspritexscale / (pFVar23->Scale).X + 103079215104.0,0);
  vis->yscale = (float)(pspriteyscale / (pFVar23->Scale).Y);
  vis->Translation = 0;
  (vis->field_13).pic = pFVar23;
  vis->ColormapNum = '\0';
  iVar12 = SUB84((pFVar23->Scale).X * pspritexiscale + 103079215104.0,0);
  if (((uint)pspr->Flags >> 6 & 1) == (uVar6 & 1 ^ 1)) {
    (vis->field_14).field_0.xiscale = -iVar12;
    fVar11 = *(int *)&pFVar23->Width * 0x10000 + -1;
  }
  else {
    (vis->field_14).field_0.xiscale = iVar12;
  }
  (vis->field_14).field_0.startfrac = fVar11;
  iVar12 = vis->x1 - iVar22;
  if (iVar12 != 0 && iVar22 <= vis->x1) {
    pfVar1 = &(vis->field_14).field_0.startfrac;
    *pfVar1 = *pfVar1 + iVar12 * (vis->field_14).field_0.xiscale;
  }
  pFVar15 = basecolormap;
  if (0x7ffffffc < pspr->ID) {
    (vis->Style).colormap = basecolormap->Maps;
    (vis->Style).RenderStyle = LegacyRenderStyles[1];
    bVar24 = false;
    goto LAB_002edcd9;
  }
  (vis->Style).Alpha = (float)owner->Alpha;
  (vis->Style).RenderStyle = owner->RenderStyle;
  bVar5 = (vis->Style).RenderStyle.field_0.Flags;
  uVar21 = (bVar5 & 0x20) >> 5 ^ 1;
  if ((bVar5 & 0x10) == 0) {
    uVar21 = bVar5 & 0x20;
  }
  pFVar15 = basecolormap;
  if ((bVar5 & 0x40) != 0) {
    fade_00.d = 0xffffff;
    if (uVar21 == 0) {
      fade_00.d = 0;
    }
    pFVar15 = GetSpecialLights((PalEntry)(basecolormap->Color).field_0.field_0,(PalEntry)fade_00,
                               basecolormap->Desaturate);
    uVar21 = 0;
  }
  pvVar2 = &vis->Style;
  if (realfixedcolormap == 0) {
    if (uVar21 != 0) {
      color = (pFVar15->Color).field_0.field_0;
      fade = PalEntry::InverseColor(&pFVar15->Fade);
      pFVar15 = GetSpecialLights((PalEntry)color,fade,pFVar15->Desaturate);
    }
    if ((long)fixedlightlev < 0) {
      if ((foggy == '\0') && ((pspr->State->StateFlags & 4) != 0)) {
        pFVar19 = pFVar15;
        if (r_fullbrightignoresectorcolor.Value != false) {
          pFVar19 = &FullNormalLight;
        }
        plVar16 = pFVar19->Maps;
      }
      else {
        iVar12 = 0x1f;
        if (spriteshade._2_2_ < 0x1f) {
          iVar12 = (int)spriteshade._2_2_;
        }
        iVar13 = 0;
        if (0 < iVar12) {
          iVar13 = iVar12;
        }
        plVar16 = pFVar15->Maps + (uint)(iVar13 << 8);
      }
    }
    else {
      pFVar19 = pFVar15;
      if (r_fullbrightignoresectorcolor.Value != false) {
        pFVar19 = &FullNormalLight;
      }
      plVar16 = pFVar19->Maps + fixedlightlev;
    }
  }
  else {
    plVar16 = (lighttable_t *)(realfixedcolormap + 0x18);
  }
  pvVar2->colormap = plVar16;
  pAVar7 = (camera->Inventory).field_0.p;
  if (pAVar7 == (AInventory *)0x0) {
LAB_002edbea:
    bVar24 = false;
  }
  else {
    if (((pAVar7->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0) {
      (camera->Inventory).field_0.p = (AInventory *)0x0;
      goto LAB_002edbea;
    }
    plVar16 = pvVar2->colormap;
    pAVar7 = (camera->Inventory).field_0.p;
    (*(pAVar7->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x2e])(pAVar7,pvVar2);
    plVar8 = pvVar2->colormap;
    if (plVar8 == plVar16) {
      bVar24 = false;
    }
    else {
      bVar24 = true;
      if (((SpecialColormaps.Array)->Colormap <= plVar8) &&
         (plVar8 <= SpecialColormaps.Array[SpecialColormaps.Count - 1].Colormap)) {
        bVar24 = pFVar15->Maps + 0x2000 <= plVar8 || plVar8 < pFVar15->Maps;
      }
    }
  }
  bVar9 = bVar24;
  if (((r_shadercolormaps.Value == false) &&
      ((SpecialColormaps.Array)->Colormap <= pvVar2->colormap)) &&
     (bVar9 = true, SpecialColormaps.Array[SpecialColormaps.Count - 1].Colormap < pvVar2->colormap))
  {
    bVar9 = bVar24;
  }
  bVar24 = true;
  if (NormalLight.Maps == realcolormaps) {
    bVar24 = bVar9;
  }
  if (pFVar15 != &NormalLight) {
    bVar24 = bVar9;
  }
  if (((!bVar24) && (realfixedcolormap == 0)) &&
     ((pFVar15 == &NormalLight && ((NormalLightHasFixedLights & 1U) != 0)))) {
    iVar12 = (*((vis->field_13).pic)->_vptr_FTexture[5])();
    bVar24 = true;
    if ((char)iVar12 == '\0') {
      bVar24 = false;
    }
  }
  pFVar19 = pFVar15;
  if (-1 < fixedlightlev) {
    pFVar19 = &FullNormalLight;
  }
  if (r_fullbrightignoresectorcolor.Value != false) {
    pFVar15 = pFVar19;
  }
  if (((r_fullbrightignoresectorcolor.Value == true) && (foggy == '\0')) &&
     ((pspr->State->StateFlags & 4) != 0)) {
    pFVar15 = &FullNormalLight;
  }
LAB_002edcd9:
  if (((!bVar24) && ((DFrameBuffer *)RenderTarget == screen)) && (screen->Accel2D != false)) {
    local_34 = (FRenderStyle)*(FRenderStyle *)&(vis->Style).RenderStyle.field_0;
    FRenderStyle::CheckFuzz(&local_34);
    if (local_34.field_0.BlendOp != '\x04') {
      if (DAT_017aabbc < vispspindex + 1) {
        uVar21 = (DAT_017aabbc - vispspindex) + 1;
        TArray<swrenderer::vispsp_t,_swrenderer::vispsp_t>::Grow
                  ((TArray<swrenderer::vispsp_t,_swrenderer::vispsp_t> *)&vispsprites,uVar21);
        DAT_017aabbc = DAT_017aabbc + uVar21;
      }
      lVar18 = vispsprites;
      uVar20 = (ulong)vispspindex;
      *(vissprite_t **)(vispsprites + uVar20 * 0x18) = vis;
      *(FDynamicColormap **)(lVar18 + 8 + uVar20 * 0x18) = pFVar15;
      *(int *)(lVar18 + 0x10 + uVar20 * 0x18) = iVar22;
      vispspindex = vispspindex + 1;
      return;
    }
  }
  R_DrawVisSprite(vis);
  return;
}

Assistant:

void R_DrawPSprite(DPSprite *pspr, AActor *owner, float bobx, float boby, double wx, double wy, double ticfrac)
{
	double 				tx;
	int 				x1;
	int 				x2;
	double				sx, sy;
	spritedef_t*		sprdef;
	spriteframe_t*		sprframe;
	FTextureID			picnum;
	WORD				flip;
	FTexture*			tex;
	vissprite_t*		vis;
	bool				noaccel;
	static TArray<vissprite_t> avis;

	if (avis.Size() < vispspindex + 1)
		avis.Reserve(avis.Size() - vispspindex + 1);

	// decide which patch to use
	if ((unsigned)pspr->GetSprite() >= (unsigned)sprites.Size())
	{
		DPrintf(DMSG_ERROR, "R_DrawPSprite: invalid sprite number %i\n", pspr->GetSprite());
		return;
	}
	sprdef = &sprites[pspr->GetSprite()];
	if (pspr->GetFrame() >= sprdef->numframes)
	{
		DPrintf(DMSG_ERROR, "R_DrawPSprite: invalid sprite frame %i : %i\n", pspr->GetSprite(), pspr->GetFrame());
		return;
	}
	sprframe = &SpriteFrames[sprdef->spriteframes + pspr->GetFrame()];

	picnum = sprframe->Texture[0];
	flip = sprframe->Flip & 1;
	tex = TexMan(picnum);

	if (tex->UseType == FTexture::TEX_Null)
		return;

	if (pspr->firstTic)
	{ // Can't interpolate the first tic.
		pspr->firstTic = false;
		pspr->oldx = pspr->x;
		pspr->oldy = pspr->y;
	}

	sx = pspr->oldx + (pspr->x - pspr->oldx) * ticfrac;
	sy = pspr->oldy + (pspr->y - pspr->oldy) * ticfrac + WEAPON_FUDGE_Y;

	if (pspr->Flags & PSPF_ADDBOB)
	{
		sx += bobx;
		sy += boby;
	}

	if (pspr->Flags & PSPF_ADDWEAPON && pspr->GetID() != PSP_WEAPON)
	{
		sx += wx;
		sy += wy;
	}

	// calculate edges of the shape
	tx = sx - BASEXCENTER;

	tx -= tex->GetScaledLeftOffset();
	x1 = xs_RoundToInt(CenterX + tx * pspritexscale);

	// off the right side
	if (x1 > viewwidth)
		return;

	tx += tex->GetScaledWidth();
	x2 = xs_RoundToInt(CenterX + tx * pspritexscale);

	// off the left side
	if (x2 <= 0)
		return;

	// store information in a vissprite
	vis = &avis[vispspindex];
	vis->renderflags = owner->renderflags;
	vis->floorclip = 0;

	vis->texturemid = (BASEYCENTER - sy) * tex->Scale.Y + tex->TopOffset;

	if (camera->player && (RenderTarget != screen ||
		viewheight == RenderTarget->GetHeight() ||
		(RenderTarget->GetWidth() > (BASEXCENTER * 2) && !st_scale)))
	{	// Adjust PSprite for fullscreen views
		AWeapon *weapon = dyn_cast<AWeapon>(pspr->GetCaller());
		if (weapon != nullptr && weapon->YAdjust != 0)
		{
			if (RenderTarget != screen || viewheight == RenderTarget->GetHeight())
			{
				vis->texturemid -= weapon->YAdjust;
			}
			else
			{
				vis->texturemid -= StatusBar->GetDisplacement() * weapon->YAdjust;
			}
		}
	}
	if (pspr->GetID() < PSP_TARGETCENTER)
	{ // Move the weapon down for 1280x1024.
		vis->texturemid -= AspectPspriteOffset(WidescreenRatio);
	}
	vis->x1 = x1 < 0 ? 0 : x1;
	vis->x2 = x2 >= viewwidth ? viewwidth : x2;
	vis->xscale = FLOAT2FIXED(pspritexscale / tex->Scale.X);
	vis->yscale = float(pspriteyscale / tex->Scale.Y);
	vis->Translation = 0;		// [RH] Use default colors
	vis->pic = tex;
	vis->ColormapNum = 0;

	if (!(flip) != !(pspr->Flags & PSPF_FLIP))
	{
		vis->xiscale = -FLOAT2FIXED(pspritexiscale * tex->Scale.X);
		vis->startfrac = (tex->GetWidth() << FRACBITS) - 1;
	}
	else
	{
		vis->xiscale = FLOAT2FIXED(pspritexiscale * tex->Scale.X);
		vis->startfrac = 0;
	}

	if (vis->x1 > x1)
		vis->startfrac += vis->xiscale*(vis->x1 - x1);

	noaccel = false;
	FDynamicColormap *colormap_to_use = nullptr;
	if (pspr->GetID() < PSP_TARGETCENTER)
	{
		vis->Style.Alpha = float(owner->Alpha);
		vis->Style.RenderStyle = owner->RenderStyle;

		// The software renderer cannot invert the source without inverting the overlay
		// too. That means if the source is inverted, we need to do the reverse of what
		// the invert overlay flag says to do.
		INTBOOL invertcolormap = (vis->Style.RenderStyle.Flags & STYLEF_InvertOverlay);

		if (vis->Style.RenderStyle.Flags & STYLEF_InvertSource)
		{
			invertcolormap = !invertcolormap;
		}

		FDynamicColormap *mybasecolormap = basecolormap;

		if (vis->Style.RenderStyle.Flags & STYLEF_FadeToBlack)
		{
			if (invertcolormap)
			{ // Fade to white
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, MAKERGB(255, 255, 255), mybasecolormap->Desaturate);
				invertcolormap = false;
			}
			else
			{ // Fade to black
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, MAKERGB(0, 0, 0), mybasecolormap->Desaturate);
			}
		}

		if (realfixedcolormap != nullptr)
		{ // fixed color
			vis->Style.colormap = realfixedcolormap->Colormap;
		}
		else
		{
			if (invertcolormap)
			{
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, mybasecolormap->Fade.InverseColor(), mybasecolormap->Desaturate);
			}
			if (fixedlightlev >= 0)
			{
				vis->Style.colormap = (r_fullbrightignoresectorcolor) ? (FullNormalLight.Maps + fixedlightlev) : (mybasecolormap->Maps + fixedlightlev);
			}
			else if (!foggy && pspr->GetState()->GetFullbright())
			{ // full bright
				vis->Style.colormap = (r_fullbrightignoresectorcolor) ? FullNormalLight.Maps : mybasecolormap->Maps;	// [RH] use basecolormap
			}
			else
			{ // local light
				vis->Style.colormap = mybasecolormap->Maps + (GETPALOOKUP(0, spriteshade) << COLORMAPSHIFT);
			}
		}
		if (camera->Inventory != nullptr)
		{
			lighttable_t *oldcolormap = vis->Style.colormap;
			camera->Inventory->AlterWeaponSprite(&vis->Style);
			if (vis->Style.colormap != oldcolormap)
			{
				// The colormap has changed. Is it one we can easily identify?
				// If not, then don't bother trying to identify it for
				// hardware accelerated drawing.
				if (vis->Style.colormap < SpecialColormaps[0].Colormap ||
					vis->Style.colormap > SpecialColormaps.Last().Colormap)
				{
					noaccel = true;
				}
				// Has the basecolormap changed? If so, we can't hardware accelerate it,
				// since we don't know what it is anymore.
				else if (vis->Style.colormap < mybasecolormap->Maps ||
					vis->Style.colormap >= mybasecolormap->Maps + NUMCOLORMAPS * 256)
				{
					noaccel = true;
				}
			}
		}
		// If we're drawing with a special colormap, but shaders for them are disabled, do
		// not accelerate.
		if (!r_shadercolormaps && (vis->Style.colormap >= SpecialColormaps[0].Colormap &&
			vis->Style.colormap <= SpecialColormaps.Last().Colormap))
		{
			noaccel = true;
		}
		// If drawing with a BOOM colormap, disable acceleration.
		if (mybasecolormap == &NormalLight && NormalLight.Maps != realcolormaps)
		{
			noaccel = true;
		}
		// If the main colormap has fixed lights, and this sprite is being drawn with that
		// colormap, disable acceleration so that the lights can remain fixed.
		if (!noaccel && realfixedcolormap == nullptr &&
			NormalLightHasFixedLights && mybasecolormap == &NormalLight &&
			vis->pic->UseBasePalette())
		{
			noaccel = true;
		}
		// [SP] If emulating GZDoom fullbright, disable acceleration
		if (r_fullbrightignoresectorcolor && fixedlightlev >= 0)
			mybasecolormap = &FullNormalLight;
		if (r_fullbrightignoresectorcolor && !foggy && pspr->GetState()->GetFullbright())
			mybasecolormap = &FullNormalLight;
		colormap_to_use = mybasecolormap;
	}
	else
	{
		colormap_to_use = basecolormap;
		vis->Style.colormap = basecolormap->Maps;
		vis->Style.RenderStyle = STYLE_Normal;
	}

	// Check for hardware-assisted 2D. If it's available, and this sprite is not
	// fuzzy, don't draw it until after the switch to 2D mode.
	if (!noaccel && RenderTarget == screen && (DFrameBuffer *)screen->Accel2D)
	{
		FRenderStyle style = vis->Style.RenderStyle;
		style.CheckFuzz();
		if (style.BlendOp != STYLEOP_Fuzz)
		{
			if (vispsprites.Size() < vispspindex + 1)
				vispsprites.Reserve(vispsprites.Size() - vispspindex + 1);

			vispsprites[vispspindex].vis = vis;
			vispsprites[vispspindex].basecolormap = colormap_to_use;
			vispsprites[vispspindex].x1 = x1;
			vispspindex++;
			return;
		}
	}
	R_DrawVisSprite(vis);
}